

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_minmax.c
# Opt level: O0

ErrorNumber do_test(TA_History *history,TA_Test_conflict15 *test)

{
  uint uVar1;
  ErrorNumber EVar2;
  int *unaff_RBX;
  double *unaff_RBP;
  uint *in_RSI;
  uint *in_RDI;
  int *unaff_R12;
  double *unaff_R14;
  double *unaff_R15;
  double *unaff_retaddr;
  double *in_stack_00000008;
  TA_RangeTestParam_conflict17 testParam;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  ErrorNumber errNb;
  TA_RetCode retCode;
  uint in_stack_ffffffffffffff3c;
  TA_Real *in_stack_ffffffffffffff40;
  uint uVar3;
  TA_Real *originalInput;
  TA_Real *in_stack_ffffffffffffff48;
  TA_Real *in_stack_ffffffffffffff50;
  TA_FuncUnstId unstId;
  TA_Real *in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff70;
  TA_Real *pTVar4;
  uint in_stack_ffffffffffffff78;
  uint uVar5;
  TA_Real *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  int iVar6;
  double *in_stack_ffffffffffffffa0;
  double *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar8;
  ErrorNumber local_48;
  TA_RetCode TVar9;
  TA_Integer optInMAType_1;
  TA_MAType in_stack_ffffffffffffffd0;
  ErrorNumber local_2c;
  
  TVar9 = TA_NOT_SUPPORTED;
  clearAllBuffers();
  uVar5 = 0;
  setInputBuffer(0,*(TA_Real **)(in_RDI + 4),*in_RDI);
  setInputBuffer(1,*(TA_Real **)(in_RDI + 6),*in_RDI);
  setInputBuffer(2,*(TA_Real **)(in_RDI + 8),*in_RDI);
  optInMAType_1 = (TA_Integer)in_RDI;
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,uVar5);
  if (in_RSI[7] == 1) {
    TVar9 = TA_SetUnstablePeriod(TA_FUNC_UNST_EMA,in_RSI[2]);
    if (TVar9 != TA_SUCCESS) {
      return TA_TEST_TFRR_SETUNSTABLE_PERIOD_FAIL;
    }
    TVar9 = TA_SUCCESS;
  }
  uVar3 = *in_RSI;
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  iVar6 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (uVar3 == 0) {
    in_stack_ffffffffffffff58 = (TA_Real *)&stack0xffffffffffffffb4;
    in_stack_ffffffffffffff40 = (TA_Real *)CONCAT44(uVar7,in_RSI[7]);
    in_stack_ffffffffffffff48 =
         (TA_Real *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),in_RSI[8]);
    in_stack_ffffffffffffff50 =
         (TA_Real *)CONCAT44((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),in_RSI[9]);
    pTVar4 = gBuffer[0].out1;
    TVar9 = TA_STOCH((int)in_RSI,TVar9,
                     (double *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,iVar6,
                     in_stack_ffffffffffffffd0,(TA_MAType)unaff_RBX,(int)unaff_R12,
                     (TA_MAType)unaff_R14,(int *)unaff_R15,(int *)unaff_RBP,unaff_retaddr,
                     in_stack_00000008);
    in_stack_ffffffffffffff70 = (uint)pTVar4;
  }
  else if (uVar3 == 1) {
    in_stack_ffffffffffffff48 = (TA_Real *)&stack0xffffffffffffffb4;
    in_stack_ffffffffffffff50 = (TA_Real *)&stack0xffffffffffffffb0;
    in_stack_ffffffffffffff40 = (TA_Real *)CONCAT44(uVar7,in_RSI[7]);
    in_stack_ffffffffffffff58 = gBuffer[0].out0;
    TVar9 = TA_STOCHF((int)in_RSI,TVar9,
                      (double *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,iVar6,
                      in_stack_ffffffffffffffd0,(TA_MAType)unaff_RBX,unaff_R12,(int *)unaff_R14,
                      unaff_R15,unaff_RBP);
  }
  else if (uVar3 == 2) {
    in_stack_ffffffffffffff40 = (TA_Real *)&stack0xffffffffffffffb4;
    in_stack_ffffffffffffff48 = (TA_Real *)&stack0xffffffffffffffb0;
    in_stack_ffffffffffffff50 = gBuffer[0].out0;
    in_stack_ffffffffffffff58 = gBuffer[0].out1;
    TVar9 = TA_STOCHRSI((int)in_stack_ffffffffffffffa8,
                        (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),in_stack_ffffffffffffff98,
                        (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (int)in_stack_ffffffffffffff90,uVar5,in_stack_ffffffffffffffd0,unaff_RBX,
                        unaff_R12,unaff_R14,unaff_R15);
  }
  local_2c = checkDataSame(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                           in_stack_ffffffffffffff3c);
  if (((local_2c == TA_TEST_PASS) &&
      (local_2c = checkDataSame(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                in_stack_ffffffffffffff3c), local_2c == TA_TEST_PASS)) &&
     (local_2c = checkDataSame(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                               in_stack_ffffffffffffff3c), local_2c == TA_TEST_PASS)) {
    uVar3 = (uint)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    local_2c = checkExpectedValue(in_stack_ffffffffffffff58,
                                  (TA_RetCode)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                  (TA_RetCode)in_stack_ffffffffffffff50,
                                  (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                                  (uint)in_stack_ffffffffffffff48,uVar3,in_stack_ffffffffffffff70,
                                  (TA_Real)CONCAT44(in_stack_ffffffffffffff3c,in_RSI[0xc]),
                                  in_stack_ffffffffffffff78);
    if (local_2c == TA_TEST_PASS) {
      local_2c = checkExpectedValue(in_stack_ffffffffffffff58,
                                    (TA_RetCode)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                    (TA_RetCode)in_stack_ffffffffffffff50,
                                    (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                                    (uint)in_stack_ffffffffffffff48,uVar3,in_stack_ffffffffffffff70,
                                    (TA_Real)CONCAT44(in_stack_ffffffffffffff3c,in_RSI[0xc]),
                                    in_stack_ffffffffffffff78);
      if (local_2c == TA_TEST_PASS) {
        uVar7 = 0;
        uVar8 = 0;
        if (*in_RSI == 0) {
          in_stack_ffffffffffffff58 = (TA_Real *)&stack0xffffffffffffffb4;
          originalInput = (TA_Real *)CONCAT44(uVar3,in_RSI[7]);
          in_stack_ffffffffffffff48 =
               (TA_Real *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),in_RSI[8]);
          in_stack_ffffffffffffff50 =
               (TA_Real *)CONCAT44((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),in_RSI[9]);
          pTVar4 = gBuffer[1].out1;
          TVar9 = referenceStoch(0,(TA_Integer)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                 in_stack_ffffffffffffff90,uVar5,(TA_Integer)in_RSI,optInMAType_1,
                                 in_stack_ffffffffffffffd0,(TA_Integer)unaff_RBX,unaff_R12,
                                 (TA_Integer *)unaff_R14,unaff_R15,unaff_RBP);
          in_stack_ffffffffffffff70 = (uint)pTVar4;
          EVar2 = checkDataSame(in_stack_ffffffffffffff48,originalInput,in_stack_ffffffffffffff3c);
          if (EVar2 != TA_TEST_PASS) {
            return EVar2;
          }
          EVar2 = checkDataSame(in_stack_ffffffffffffff48,originalInput,in_stack_ffffffffffffff3c);
          if (EVar2 != TA_TEST_PASS) {
            return EVar2;
          }
          EVar2 = checkDataSame(in_stack_ffffffffffffff48,originalInput,in_stack_ffffffffffffff3c);
          if (EVar2 != TA_TEST_PASS) {
            return EVar2;
          }
          uVar3 = (uint)((ulong)originalInput >> 0x20);
          EVar2 = checkExpectedValue(in_stack_ffffffffffffff58,
                                     (TA_RetCode)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                     (TA_RetCode)in_stack_ffffffffffffff50,
                                     (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                                     (uint)in_stack_ffffffffffffff48,uVar3,in_stack_ffffffffffffff70
                                     ,(TA_Real)CONCAT44(in_stack_ffffffffffffff3c,in_RSI[0xc]),
                                     in_stack_ffffffffffffff78);
          if (EVar2 != TA_TEST_PASS) {
            printf("Fail for output id=%d\n",0);
            return EVar2;
          }
          EVar2 = checkExpectedValue(in_stack_ffffffffffffff58,
                                     (TA_RetCode)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                     (TA_RetCode)in_stack_ffffffffffffff50,
                                     (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                                     (uint)in_stack_ffffffffffffff48,uVar3,in_stack_ffffffffffffff70
                                     ,(TA_Real)CONCAT44(in_stack_ffffffffffffff3c,in_RSI[0xc]),
                                     in_stack_ffffffffffffff78);
          if (EVar2 != TA_TEST_PASS) {
            printf("Fail for output id=%d\n",1);
            return EVar2;
          }
          EVar2 = checkSameContent(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
          if (EVar2 != TA_TEST_PASS) {
            return EVar2;
          }
          EVar2 = checkSameContent(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
          if (EVar2 != TA_TEST_PASS) {
            return EVar2;
          }
        }
        uVar1 = *in_RSI;
        iVar6 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        if (uVar1 == 0) {
          in_stack_ffffffffffffff58 = (TA_Real *)&stack0xffffffffffffffb4;
          in_stack_ffffffffffffff48 =
               (TA_Real *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),in_RSI[8]);
          in_stack_ffffffffffffff50 =
               (TA_Real *)CONCAT44((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),in_RSI[9]);
          pTVar4 = gBuffer[1].in;
          TA_STOCH((int)in_RSI,TVar9,(double *)CONCAT44(uVar8,uVar7),in_stack_ffffffffffffffa8,
                   in_stack_ffffffffffffffa0,iVar6,in_stack_ffffffffffffffd0,(TA_MAType)unaff_RBX,
                   (int)unaff_R12,(TA_MAType)unaff_R14,(int *)unaff_R15,(int *)unaff_RBP,
                   unaff_retaddr,in_stack_00000008);
          in_stack_ffffffffffffff70 = (uint)pTVar4;
        }
        else if (uVar1 == 1) {
          in_stack_ffffffffffffff48 = (TA_Real *)&stack0xffffffffffffffb4;
          in_stack_ffffffffffffff50 = (TA_Real *)&stack0xffffffffffffffb0;
          in_stack_ffffffffffffff58 = gBuffer[0].in;
          TA_STOCHF((int)in_RSI,TVar9,(double *)CONCAT44(uVar8,uVar7),in_stack_ffffffffffffffa8,
                    in_stack_ffffffffffffffa0,iVar6,in_stack_ffffffffffffffd0,(TA_MAType)unaff_RBX,
                    unaff_R12,(int *)unaff_R14,unaff_R15,unaff_RBP);
        }
        else if (uVar1 == 2) {
          uVar3 = (uint)((ulong)&stack0xffffffffffffffb4 >> 0x20);
          in_stack_ffffffffffffff48 = (TA_Real *)&stack0xffffffffffffffb0;
          in_stack_ffffffffffffff50 = gBuffer[0].in;
          in_stack_ffffffffffffff58 = gBuffer[1].in;
          TA_STOCHRSI((int)in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20)
                      ,in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      (int)in_stack_ffffffffffffff90,uVar5,in_stack_ffffffffffffffd0,unaff_RBX,
                      unaff_R12,unaff_R14,unaff_R15);
        }
        local_2c = checkSameContent(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        if ((local_2c == TA_TEST_PASS) &&
           (local_2c = checkSameContent(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50),
           local_2c == TA_TEST_PASS)) {
          local_2c = checkExpectedValue(in_stack_ffffffffffffff58,
                                        (TA_RetCode)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                        (TA_RetCode)in_stack_ffffffffffffff50,
                                        (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                                        (uint)in_stack_ffffffffffffff48,uVar3,
                                        in_stack_ffffffffffffff70,
                                        (TA_Real)CONCAT44(in_stack_ffffffffffffff3c,in_RSI[0xc]),
                                        in_stack_ffffffffffffff78);
          if (local_2c == TA_TEST_PASS) {
            uVar5 = in_RSI[0x10];
            local_2c = checkExpectedValue(in_stack_ffffffffffffff58,
                                          (TA_RetCode)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                          (TA_RetCode)in_stack_ffffffffffffff50,
                                          (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                                          (uint)in_stack_ffffffffffffff48,uVar3,
                                          in_stack_ffffffffffffff70,
                                          (TA_Real)CONCAT44(in_stack_ffffffffffffff3c,in_RSI[0xc]),
                                          in_stack_ffffffffffffff78);
            if (local_2c == TA_TEST_PASS) {
              if (in_RSI[1] != 0) {
                unstId = (TA_FuncUnstId)((ulong)in_stack_ffffffffffffff50 >> 0x20);
                if (*in_RSI < 2) {
                  local_48 = doRangeTest((RangeTestFunction)in_stack_ffffffffffffff58,unstId,
                                         in_stack_ffffffffffffff48,uVar3,uVar5);
                }
                else {
                  local_48 = TA_TEST_PASS;
                  if (*in_RSI == 2) {
                    local_48 = doRangeTest((RangeTestFunction)in_stack_ffffffffffffff58,unstId,
                                           in_stack_ffffffffffffff48,uVar3,uVar5);
                  }
                }
                if (local_48 != TA_TEST_PASS) {
                  return local_48;
                }
              }
              local_2c = TA_TEST_PASS;
            }
            else {
              printf("Fail for output id=%d\n",1);
            }
          }
          else {
            printf("Fail for output id=%d\n",0);
          }
        }
      }
      else {
        printf("Fail for output id=%d\n",1);
      }
    }
    else {
      printf("Fail for output id=%d\n",0);
    }
  }
  return local_2c;
}

Assistant:

static ErrorNumber do_test( const TA_History *history,
                            const TA_Test *test )
{
   TA_RetCode retCode;
   ErrorNumber errNb;
   TA_Integer outBegIdx;
   TA_Integer outNbElement;
   TA_RangeTestParam testParam;

   /* Set to NAN all the elements of the gBuffers.  */
   clearAllBuffers();

   /* Build the input. */
   setInputBuffer( 0, history->open, history->nbBars );
   setInputBuffer( 1, history->open, history->nbBars );

   CLEAR_EXPECTED_VALUE(0);

   /* Do a systematic test of most of the
    * possible startIdx/endIdx range.
    */
   testParam.test  = test;
   testParam.close = history->close;

   if( test->doRangeTestFlag )
   {
      errNb = doRangeTest( rangeTestFunction,
                           TA_FUNC_UNST_NONE,
                           (void *)&testParam, 1, 0 );
      if( errNb != TA_TEST_PASS )
         return errNb;
   }


   /* Make a simple first call. */
   if( test->theFunction == TA_MIN_TEST )
   {
      retCode = TA_MIN( test->startIdx,
                        test->endIdx,
                        gBuffer[0].in,
                        test->optInTimePeriod,
                        &outBegIdx,
                        &outNbElement,
                        gBuffer[0].out0 );
   }
   else if( test->theFunction == TA_MAX_TEST )
   {
      retCode = TA_MAX( test->startIdx,
                        test->endIdx,
                        gBuffer[0].in,
                        test->optInTimePeriod,
                        &outBegIdx,
                        &outNbElement,
                        gBuffer[0].out0 );
   }
   else
   {
      /* For now, tests only MIN and MAX. Only range check tests implemented. */
      return TA_TEST_PASS;
   }

   errNb = checkDataSame( gBuffer[0].in, history->open,history->nbBars );
   if( errNb != TA_TEST_PASS )
      return errNb;

   CHECK_EXPECTED_VALUE( gBuffer[0].out0, 0 );

   outBegIdx = outNbElement = 0;

   /* Make another call where the input and the output are the
    * same buffer.
    */
   CLEAR_EXPECTED_VALUE(0);
   if( test->theFunction == TA_MIN_TEST )
   {
      retCode = TA_MIN( test->startIdx,
                        test->endIdx,
                        gBuffer[1].in,
                        test->optInTimePeriod,
                        &outBegIdx,
                        &outNbElement,
                        gBuffer[1].in );
   }
   else if( test->theFunction == TA_MAX_TEST )
   {
      retCode = TA_MAX( test->startIdx,
                        test->endIdx,
                        gBuffer[1].in,
                        test->optInTimePeriod,
                        &outBegIdx,
                        &outNbElement,
                        gBuffer[1].in );
   }

   /* The previous call should have the same output as this call.
    *
    * checkSameContent verify that all value different than NAN in
    * the first parameter is identical in the second parameter.
    */
   errNb = checkSameContent( gBuffer[0].out0, gBuffer[1].in );
   if( errNb != TA_TEST_PASS )
      return errNb;

   CHECK_EXPECTED_VALUE( gBuffer[1].in, 0 );

   if( errNb != TA_TEST_PASS )
      return errNb;


   return TA_TEST_PASS;
}